

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&,_cs::tree_type<cs::token_base_*>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&,_cs::tree_type<cs::token_base_*>_&)>
::call(cni_helper<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&,_cs::tree_type<cs::token_base_*>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&,_cs::tree_type<cs::token_base_*>_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  sequence<0,_1> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*(long *)(in_RDX + 8) - *(long *)in_RDX == 0x10) {
    cni_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,cs::tree_type<cs::token_base*>&),cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,cs::tree_type<cs::token_base*>&)>
    ::_call<0,1>((cni_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,cs::tree_type<cs::token_base*>&),cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,cs::tree_type<cs::token_base*>&)>
                  *)&local_c0,args,in_RDX);
    if (local_c0._M_dataplus._M_p != (pointer)0x0) {
      *(long *)(local_c0._M_dataplus._M_p + 8) = *(long *)(local_c0._M_dataplus._M_p + 8) + 1;
    }
    *(pointer *)&(this->mFunc).super__Function_base._M_functor = local_c0._M_dataplus._M_p;
    any::recycle((any *)&local_c0);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_80,2);
  std::operator+(&local_60,"Wrong size of the arguments. Expected ",&local_80);
  std::operator+(&local_40,&local_60,", provided ");
  std::__cxx11::to_string(&local_a0,*(long *)(in_RDX + 8) - *(long *)in_RDX >> 3);
  std::operator+(&local_c0,&local_40,&local_a0);
  cs::runtime_error::runtime_error(this_00,&local_c0);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}